

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2Dgridsearch.cpp
# Opt level: O3

bool __thiscall
SBPL2DGridSearch::search_withbuckets
          (SBPL2DGridSearch *this,uchar **Grid2D,uchar obsthresh,int startx_c,int starty_c,
          int goalx_c,int goaly_c)

{
  SBPL_2DGridSearchState *pSVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  AbstractSearchState *pAVar9;
  runtime_error *this_00;
  undefined7 in_register_00000011;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  CBucket OPEN2DBLIST;
  CBucket local_68;
  
  clock();
  iVar12 = (int)CONCAT71(in_register_00000011,obsthresh);
  iVar8 = this->height_;
  if (this->height_ < this->width_) {
    iVar8 = this->width_;
  }
  CBucket::CBucket(&local_68,0,
                   (int)((double)iVar8 * (double)this->dxy_distance_mm_[0] * (double)iVar12 * 0.1));
  iVar8 = this->iteration_ + 1;
  this->iteration_ = iVar8;
  this->startX_ = startx_c;
  this->startY_ = starty_c;
  this->goalX_ = goalx_c;
  this->goalY_ = goaly_c;
  if ((starty_c < this->height_ && (startx_c < this->width_ && -1 < (starty_c | startx_c))) &&
     ((goalx_c < this->width_ && -1 < (goaly_c | goalx_c)) && goaly_c < this->height_)) {
    pSVar1 = this->searchStates2D_[startx_c] + starty_c;
    pSVar1->iterationaccessed = iVar8;
    pSVar1->g = 0;
    (pSVar1->super_AbstractSearchState).heapindex = -1;
    CBucket::insert(&local_68,&pSVar1->super_AbstractSearchState,0);
    while (local_68.currentminelement_bucketind != 1000000000) {
      pAVar9 = CBucket::popminelement(&local_68);
      iVar8 = *(int *)pAVar9[1].listelem;
      iVar2 = *(int *)((long)pAVar9[1].listelem + 4);
      uVar11 = 0;
      do {
        lVar10 = (long)this->dx_[uVar11] + (long)iVar8;
        lVar14 = (long)this->dy_[uVar11] + (long)iVar2;
        uVar13 = (uint)lVar14;
        uVar15 = (uint)lVar10;
        if (((-1 < (int)(uVar13 | uVar15)) && ((int)uVar15 < this->width_)) &&
           ((int)uVar13 < this->height_)) {
          bVar6 = (*this->getCost)(Grid2D,uVar15,uVar13,this->downsample_);
          bVar7 = (*this->getCost)(Grid2D,iVar8,iVar2,this->downsample_);
          lVar4 = lVar14;
          lVar5 = lVar10;
          if (bVar6 <= bVar7) {
            lVar4 = (long)iVar2;
            lVar5 = (long)iVar8;
          }
          bVar6 = (*this->getCost)(Grid2D,(int)lVar5,(int)lVar4,this->downsample_);
          uVar15 = (uint)bVar6;
          if (7 < uVar11) {
            bVar7 = (*this->getCost)(Grid2D,this->dx0intersects_[uVar11] + iVar8,
                                     this->dy0intersects_[uVar11] + iVar2,this->downsample_);
            if (bVar6 <= bVar7) {
              bVar6 = (*this->getCost)(Grid2D,this->dx0intersects_[uVar11] + iVar8,
                                       this->dy0intersects_[uVar11] + iVar2,this->downsample_);
              uVar15 = (uint)bVar6;
            }
            bVar6 = (*this->getCost)(Grid2D,this->dx1intersects_[uVar11] + iVar8,
                                     this->dy1intersects_[uVar11] + iVar2,this->downsample_);
            if (uVar15 <= bVar6) {
              bVar6 = (*this->getCost)(Grid2D,this->dx1intersects_[uVar11] + iVar8,
                                       this->dy1intersects_[uVar11] + iVar2,this->downsample_);
              uVar15 = (uint)bVar6;
            }
          }
          if ((int)uVar15 < iVar12) {
            iVar16 = (uVar15 + 1) * this->dxy_distance_mm_[uVar11];
            pSVar1 = this->searchStates2D_[lVar10] + lVar14;
            iVar17 = this->iteration_;
            if (pSVar1->iterationaccessed == iVar17) {
              iVar3 = pSVar1->g;
              iVar16 = iVar16 + *(int *)(pAVar9[1].listelem + 1);
              if (iVar3 <= iVar16) goto LAB_00145857;
            }
            else {
              (pSVar1->super_AbstractSearchState).heapindex = -1;
              iVar3 = pSVar1->g;
              iVar16 = iVar16 + *(int *)(pAVar9[1].listelem + 1);
            }
            pSVar1->iterationaccessed = iVar17;
            iVar17 = iVar16;
            if (999999999 < iVar16) {
              iVar17 = 1000000000;
            }
            pSVar1->g = iVar17;
            if (999999999 < iVar16) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"ERROR: infinite g");
              *(undefined ***)this_00 = &PTR__runtime_error_00157508;
              __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
            }
            if ((pSVar1->super_AbstractSearchState).heapindex != -1) {
              if (iVar3 == 1000000000) {
                iVar17 = local_68.numofbuckets + -1;
              }
              else {
                iVar17 = iVar3 - local_68.firstpriority;
                if (local_68.numofbuckets + -2 <= iVar3 - local_68.firstpriority) {
                  iVar17 = local_68.numofbuckets + -2;
                }
              }
              CBucket::removestategivenbucketindex
                        (&local_68,&pSVar1->super_AbstractSearchState,iVar17);
              iVar17 = pSVar1->g;
            }
            CBucket::insert(&local_68,&pSVar1->super_AbstractSearchState,iVar17);
          }
        }
LAB_00145857:
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0x10);
    }
    this->largestcomputedoptf_ = 1000000000;
  }
  CBucket::~CBucket(&local_68);
  return false;
}

Assistant:

bool SBPL2DGridSearch::search_withbuckets(unsigned char** Grid2D, unsigned char obsthresh, int startx_c, int starty_c,
                                          int goalx_c, int goaly_c)
{
    SBPL_2DGridSearchState *searchExpState = NULL;
    SBPL_2DGridSearchState *searchPredState = NULL;
    int numofExpands = 0;

    //get the current time
    clock_t starttime = clock();

    //int max_bucketed_priority = obsthresh*10*__max(this->width_, this->height_);
    int max_bucketed_priority = (int)(0.1 * obsthresh * dxy_distance_mm_[0] * __max(this->width_, this->height_));
    SBPL_PRINTF("bucket-based OPEN2D has up to %d bucketed priorities, the rest will be unsorted\n",
                max_bucketed_priority);
    CBucket OPEN2DBLIST(0, max_bucketed_priority);

    SBPL_PRINTF("OPEN2D allocation time=%d msecs\n", (int)(((clock() - starttime) / (double)CLOCKS_PER_SEC) * 1000));

    //closed = 0
    iteration_++;

    //init start and goal coordinates
    startX_ = startx_c;
    startY_ = starty_c;
    goalX_ = goalx_c;
    goalY_ = goaly_c;

    //check the validity of start/goal
    if (!withinMap(startx_c, starty_c) || !withinMap(goalx_c, goaly_c)) {
        SBPL_ERROR("ERROR: grid2Dsearch is called on invalid start (%d %d) or goal(%d %d)\n", startx_c, starty_c,
                   goalx_c, goaly_c);
        return false;
    }

    // initialize the start and goal states
    searchExpState = &searchStates2D_[startX_][startY_];
    initializeSearchState2D(searchExpState);
    //no initialization for the goal state - it will reset iteration_ variable

    //seed the search
    searchExpState->g = 0;
    searchExpState->heapindex = -1;
    OPEN2DBLIST.insert(searchExpState, searchExpState->g);

    //the main repetition of expansions
    while (!OPEN2DBLIST.empty()) {
        //get the next state for expansion
        searchExpState = (SBPL_2DGridSearchState*)OPEN2DBLIST.popminelement();
        numofExpands++;

        int exp_x = searchExpState->x;
        int exp_y = searchExpState->y;

        //iterate over successors
        for (int dir = 0; dir < SBPL_2DGRIDSEARCH_NUMOF2DDIRS; dir++) {
            int newx = exp_x + dx_[dir];
            int newy = exp_y + dy_[dir];

            //make sure it is inside the map and has no obstacle
            if (!withinMap(newx, newy)) continue;

            //compute the cost
            int mapcost = __max( getCost(Grid2D, newx, newy, downsample_), getCost(Grid2D, exp_x, exp_y, downsample_));

#if SBPL_2DGRIDSEARCH_NUMOF2DDIRS > 8
            if(dir > 7) {
                //check two more cells through which the action goes
                mapcost = __max(mapcost, getCost(Grid2D, exp_x + dx0intersects_[dir], exp_y + dy0intersects_[dir], downsample_));
                mapcost = __max(mapcost, getCost(Grid2D, exp_x + dx1intersects_[dir], exp_y + dy1intersects_[dir], downsample_));
            }
#endif

            if (mapcost >= obsthresh) //obstacle encountered
            continue;
            int cost = (mapcost + 1) * dxy_distance_mm_[dir];

            //get the predecessor
            searchPredState = &searchStates2D_[newx][newy];

            //clear the element from OPEN
            if (searchPredState->iterationaccessed != iteration_) searchPredState->heapindex = -1;

            //update predecessor if necessary
            if (searchPredState->iterationaccessed != iteration_ || searchPredState->g > cost + searchExpState->g) {
                int oldstatepriority = searchPredState->g;
                searchPredState->iterationaccessed = iteration_;
                searchPredState->g = __min(INFINITECOST, cost + searchExpState->g);

                if (searchPredState->g >= INFINITECOST) {
                    throw SBPL_Exception("ERROR: infinite g");
                }

                //put it into the list if not there already
                if (searchPredState->heapindex != -1) OPEN2DBLIST.remove(searchPredState, oldstatepriority);
                OPEN2DBLIST.insert(searchPredState, searchPredState->g);
            }
        } //over successors
    }//while

    //set lower bounds for the remaining states
    if (!OPEN2DBLIST.empty())
        largestcomputedoptf_ = OPEN2DBLIST.getminpriority();
    else
        largestcomputedoptf_ = INFINITECOST;

    SBPL_PRINTF( "# of expands during 2dgridsearch=%d time=%d msecs 2Dsolcost_inmm=%d "
                "largestoptfval=%d bucketassortedarraymaxsize=%d (start=%d %d goal=%d %d)\n",
                numofExpands, (int)(((clock() - starttime) / (double)CLOCKS_PER_SEC) * 1000),
                searchStates2D_[goalx_c][goaly_c].g, largestcomputedoptf_, OPEN2DBLIST.maxassortedpriorityVsize,
                startx_c, starty_c, goalx_c, goaly_c);

    return false;
}